

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_73520::PyIterCtrlPMatchSource<cpsm::FullLineMatch>::fill
          (PyIterCtrlPMatchSource<cpsm::FullLineMatch> *this,
          vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
          *items)

{
  pointer *ppPVar1;
  pointer pPVar2;
  size_t sVar3;
  _Head_base<0UL,__object_*,_false> _Var4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  pointer pPVar8;
  undefined8 uVar9;
  _Head_base<0UL,__object_*,_false> _Var10;
  pointer pPVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pPVar15;
  _Head_base<0UL,__object_*,_false> local_70;
  undefined4 local_64;
  _Head_base<0UL,__object_*,_false> local_60;
  pointer local_58;
  pthread_mutex_t *local_50;
  ulong local_48;
  vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
  *local_40;
  pointer local_38;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar5 != 0) {
    uVar9 = std::__throw_system_error(iVar5);
    std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
              ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_70);
    pthread_mutex_unlock(local_50);
    _Unwind_Resume(uVar9);
  }
  if (this->done_ == false) {
    local_64 = 0;
    uVar7 = 0;
    local_50 = (pthread_mutex_t *)this;
    local_40 = items;
    do {
      local_70._M_head_impl =
           (_object *)PyIter_Next(((pthread_mutex_t *)((long)this + 0x28))->__align);
      if ((local_70._M_head_impl == (_object *)0x0) ||
         (local_48 = uVar7,
         pcVar6 = (char *)PyUnicode_AsUTF8AndSize(local_70._M_head_impl,&local_38),
         _Var4._M_head_impl = local_70._M_head_impl, pcVar6 == (char *)0x0)) {
        std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                  ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_70);
LAB_001215e3:
        *(undefined1 *)((long)this + 0x30) = 1;
        break;
      }
      pPVar2 = (items->
               super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar2 == (items->
                    super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pPVar15 = (items->
                  super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((long)pPVar2 - (long)pPVar15 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        lVar12 = (long)pPVar2 - (long)pPVar15 >> 3;
        uVar13 = lVar12 * -0x5555555555555555;
        uVar7 = uVar13;
        if (pPVar2 == pPVar15) {
          uVar7 = 1;
        }
        uVar14 = uVar7 + uVar13;
        if (0x555555555555554 < uVar14) {
          uVar14 = 0x555555555555555;
        }
        if (CARRY8(uVar7,uVar13)) {
          uVar14 = 0x555555555555555;
        }
        if (uVar14 == 0) {
          pPVar8 = (pointer)0x0;
          pPVar11 = local_38;
        }
        else {
          local_58 = local_38;
          pPVar8 = (pointer)operator_new(uVar14 * 0x18);
          pPVar11 = local_58;
        }
        _Var10._M_head_impl = local_70._M_head_impl;
        local_70._M_head_impl = (_object *)0x0;
        *(char **)((long)&(pPVar8->inner).inner.item_ + lVar12 * 8) = pcVar6;
        *(pointer *)((long)&(pPVar8->inner).inner.item_ + lVar12 * 8 + 8) = pPVar11;
        (&pPVar8->obj)[lVar12]._M_t =
             (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
             _Var10._M_head_impl;
        local_60._M_head_impl = (_object *)0x0;
        std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                  ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_60);
        local_58 = pPVar15;
        pPVar11 = pPVar8;
        for (; pPVar2 != pPVar15; pPVar15 = pPVar15 + 1) {
          sVar3 = (pPVar15->inner).inner.item_.len_;
          (pPVar11->inner).inner.item_.ptr_ = (pPVar15->inner).inner.item_.ptr_;
          *(size_t *)((long)&(pPVar11->inner).inner.item_ + 8) = sVar3;
          (pPVar11->obj)._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>
          ._M_t = (tuple<_object_*,_(anonymous_namespace)::PyObjectDeleter>)
                  (pPVar15->obj)._M_t.
                  super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
                  super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
                  super__Head_base<0UL,__object_*,_false>._M_head_impl;
          (pPVar15->obj)._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>
          ._M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
          super__Head_base<0UL,__object_*,_false>._M_head_impl = (_object *)0x0;
          std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                    (&pPVar15->obj);
          pPVar11 = pPVar11 + 1;
        }
        if (local_58 != (pointer)0x0) {
          operator_delete(local_58);
        }
        (local_40->
        super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
        )._M_impl.super__Vector_impl_data._M_start = pPVar8;
        (local_40->
        super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pPVar11 + 1;
        (local_40->
        super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar8 + uVar14;
        this = (PyIterCtrlPMatchSource<cpsm::FullLineMatch> *)local_50;
        items = local_40;
      }
      else {
        _Var10._M_head_impl = (_object *)0x0;
        local_70._M_head_impl = (_object *)0x0;
        (pPVar2->inner).inner.item_.ptr_ = pcVar6;
        (pPVar2->inner).inner.item_.len_ = (size_t)local_38;
        (pPVar2->obj)._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
        _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
        super__Head_base<0UL,__object_*,_false>._M_head_impl = _Var4._M_head_impl;
        local_60._M_head_impl = (_object *)0x0;
        std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                  ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_60);
        ppPVar1 = &(items->
                   super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + 1;
      }
      uVar13 = local_48;
      std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_70);
      if (pcVar6 == (char *)0x0) goto LAB_001215e3;
      uVar7 = uVar13 + 1;
      local_64 = (undefined4)CONCAT71((int7)((ulong)_Var10._M_head_impl >> 8),0x1fe < uVar13);
    } while (uVar7 != 0x200);
  }
  else {
    local_64 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return (bool)((byte)local_64 & 1);
}

Assistant:

bool fill(std::vector<Item>& items) {
    std::lock_guard<std::mutex> lock(mu_);
    if (done_) {
      return false;
    }
    auto const add_item = [&](PyObjPtr item_obj) {
      if (item_obj == nullptr) {
        return false;
      }
      char* item_data;
      Py_ssize_t item_size;
      if (!PyVimString_AsStringAndSize(item_obj.get(), &item_data,
                                       &item_size)) {
        return false;
      }
      items.emplace_back(
          cpsm::CtrlPItem<cpsm::StringRefItem, MatchMode>(
              (cpsm::StringRefItem(boost::string_ref(item_data, item_size)))),
          std::move(item_obj));
      return true;
    };
    for (Py_ssize_t i = 0; i < batch_size(); i++) {
      if (!add_item(PyObjPtr(PyIter_Next(iter_)))) {
        done_ = true;
        return false;
      }
    }
    return true;
  }